

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_find_filter(png_structrp png_ptr,png_row_infop row_info)

{
  ulong uVar1;
  png_bytep ppVar2;
  byte *pbVar3;
  size_t i;
  byte *input;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint uVar14;
  long lVar15;
  byte *pbVar16;
  uint uVar17;
  uint uVar18;
  size_t sum;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  byte *pbVar22;
  size_t lmins_2;
  
  bVar9 = png_ptr->do_filter;
  uVar1 = row_info->rowbytes;
  bVar10 = row_info->pixel_depth;
  uVar14 = bVar10 + 7 >> 3;
  uVar4 = (ulong)uVar14;
  pbVar5 = png_ptr->row_buf;
  if (uVar1 < 0x1ffffffffffffff) {
    uVar19 = 0xfffffffffffffeff;
    if ((bVar9 != 8 & bVar9 >> 3) == 1) {
      uVar19 = 0;
      for (uVar20 = 0; uVar1 != uVar20; uVar20 = uVar20 + 1) {
        bVar8 = pbVar5[uVar20 + 1];
        uVar17 = 0x100 - bVar8;
        if (-1 < (char)bVar8) {
          uVar17 = (uint)bVar8;
        }
        uVar19 = uVar19 + uVar17;
      }
    }
  }
  else {
    bVar9 = bVar9 & -bVar9;
    uVar19 = 0xfffffffffffffeff;
  }
  if (bVar9 == 0x10) {
    input = png_ptr->try_row;
    *input = 1;
    for (uVar20 = 0; uVar4 != uVar20; uVar20 = uVar20 + 1) {
      input[uVar20 + 1] = pbVar5[uVar20 + 1];
    }
    for (lVar7 = 0; uVar4 + lVar7 < uVar1; lVar7 = lVar7 + 1) {
      input[uVar20 + lVar7 + 1] = pbVar5[uVar20 + lVar7 + 1] - pbVar5[lVar7 + 1];
    }
  }
  else {
    input = pbVar5;
    if ((bVar9 & 0x10) != 0) {
      pbVar12 = png_ptr->try_row;
      *pbVar12 = 1;
      uVar21 = 0;
      for (uVar20 = 0; uVar4 != uVar20; uVar20 = uVar20 + 1) {
        bVar8 = pbVar5[uVar20 + 1];
        pbVar12[uVar20 + 1] = bVar8;
        uVar17 = 0x100 - bVar8;
        if (-1 < (char)bVar8) {
          uVar17 = (uint)bVar8;
        }
        uVar21 = uVar21 + uVar17;
      }
      for (lVar7 = 0; uVar4 + lVar7 < uVar1; lVar7 = lVar7 + 1) {
        bVar8 = pbVar5[uVar20 + lVar7 + 1] - pbVar5[lVar7 + 1];
        pbVar12[uVar20 + lVar7 + 1] = bVar8;
        uVar17 = 0x100 - bVar8;
        if (-1 < (char)bVar8) {
          uVar17 = (uint)bVar8;
        }
        uVar21 = uVar21 + uVar17;
        if (uVar19 < uVar21) break;
      }
      if ((uVar21 < uVar19) &&
         (input = pbVar12, uVar19 = uVar21, png_ptr->tst_row != (png_bytep)0x0)) {
        png_ptr->try_row = png_ptr->tst_row;
        png_ptr->tst_row = pbVar12;
      }
    }
  }
  if (bVar9 == 0x20) {
    input = png_ptr->try_row;
    *input = 2;
    ppVar2 = png_ptr->prev_row;
    for (uVar20 = 0; uVar1 != uVar20; uVar20 = uVar20 + 1) {
      input[uVar20 + 1] = pbVar5[uVar20 + 1] - ppVar2[uVar20 + 1];
    }
  }
  else if ((bVar9 & 0x20) != 0) {
    pbVar12 = png_ptr->try_row;
    *pbVar12 = 2;
    ppVar2 = png_ptr->prev_row;
    uVar20 = 0;
    uVar21 = 0;
    do {
      if (uVar1 == uVar20) break;
      bVar8 = pbVar5[uVar20 + 1] - ppVar2[uVar20 + 1];
      uVar17 = 0x100 - bVar8;
      if (-1 < (char)bVar8) {
        uVar17 = (uint)bVar8;
      }
      pbVar12[uVar20 + 1] = bVar8;
      uVar21 = uVar21 + uVar17;
      uVar20 = uVar20 + 1;
    } while (uVar21 <= uVar19);
    if ((uVar21 < uVar19) && (input = pbVar12, uVar19 = uVar21, png_ptr->tst_row != (png_bytep)0x0))
    {
      png_ptr->try_row = png_ptr->tst_row;
      png_ptr->tst_row = pbVar12;
    }
  }
  if (bVar9 == 0x40) {
    input = png_ptr->try_row;
    *input = 3;
    ppVar2 = png_ptr->prev_row;
    for (lVar7 = 1; (int)lVar7 - uVar14 != 1; lVar7 = lVar7 + 1) {
      input[lVar7] = pbVar5[lVar7] - (ppVar2[lVar7] >> 1);
    }
    for (lVar15 = 0; (bVar10 + 7 >> 3) + (int)lVar15 < uVar1; lVar15 = lVar15 + 1) {
      input[lVar7 + lVar15] =
           pbVar5[lVar7 + lVar15] -
           (char)((uint)pbVar5[lVar15 + 1] + (uint)ppVar2[lVar7 + lVar15] >> 1);
    }
  }
  else if ((bVar9 & 0x40) != 0) {
    pbVar12 = png_ptr->try_row;
    *pbVar12 = 3;
    ppVar2 = png_ptr->prev_row;
    uVar20 = 0;
    for (lVar7 = 1; (int)lVar7 - uVar14 != 1; lVar7 = lVar7 + 1) {
      bVar8 = pbVar5[lVar7] - (ppVar2[lVar7] >> 1);
      pbVar12[lVar7] = bVar8;
      uVar17 = 0x100 - bVar8;
      if (-1 < (char)bVar8) {
        uVar17 = (uint)bVar8;
      }
      uVar20 = uVar20 + uVar17;
    }
    for (lVar15 = 0; (bVar10 + 7 >> 3) + (int)lVar15 < uVar1; lVar15 = lVar15 + 1) {
      bVar8 = pbVar5[lVar7 + lVar15] -
              (char)((uint)pbVar5[lVar15 + 1] + (uint)ppVar2[lVar7 + lVar15] >> 1);
      pbVar12[lVar7 + lVar15] = bVar8;
      uVar14 = 0x100 - bVar8;
      if (-1 < (char)bVar8) {
        uVar14 = (uint)bVar8;
      }
      uVar20 = uVar20 + uVar14;
      if (uVar19 < uVar20) break;
    }
    if ((uVar20 < uVar19) && (input = pbVar12, uVar19 = uVar20, png_ptr->tst_row != (png_bytep)0x0))
    {
      png_ptr->try_row = png_ptr->tst_row;
      png_ptr->tst_row = pbVar12;
    }
  }
  if (bVar9 == 0x80) {
    input = png_ptr->try_row;
    *input = 4;
    pbVar12 = png_ptr->prev_row;
    pbVar11 = input;
    pbVar13 = pbVar12;
    pbVar16 = pbVar5;
    for (uVar19 = 0; pbVar22 = input, uVar19 != uVar4; uVar19 = uVar19 + 1) {
      pbVar11 = pbVar11 + 1;
      pbVar13 = pbVar13 + 1;
      pbVar16 = pbVar16 + 1;
      *pbVar11 = *pbVar16 - *pbVar13;
    }
    while( true ) {
      pbVar12 = pbVar12 + 1;
      pbVar5 = pbVar5 + 1;
      if (uVar1 <= uVar4) break;
      bVar9 = *pbVar12;
      uVar17 = (uint)pbVar12[uVar19] - (uint)bVar9;
      uVar18 = (uint)*pbVar5 - (uint)bVar9;
      uVar14 = -uVar17;
      if (0 < (int)uVar17) {
        uVar14 = uVar17;
      }
      uVar6 = -uVar18;
      if (0 < (int)uVar18) {
        uVar6 = uVar18;
      }
      uVar18 = uVar18 + uVar17;
      uVar17 = -uVar18;
      if (0 < (int)uVar18) {
        uVar17 = uVar18;
      }
      if ((uVar6 & 0xff) <= uVar17) {
        bVar9 = pbVar12[uVar19];
      }
      bVar10 = *pbVar5;
      if (uVar17 < (uVar14 & 0xff)) {
        bVar10 = bVar9;
      }
      if ((uVar6 & 0xff) < (uVar14 & 0xff)) {
        bVar10 = bVar9;
      }
      (pbVar22 + 1)[uVar19] = pbVar5[uVar19] - bVar10;
      uVar4 = uVar4 + 1;
      pbVar22 = pbVar22 + 1;
    }
  }
  else if ((char)bVar9 < '\0') {
    pbVar12 = png_ptr->try_row;
    *pbVar12 = 4;
    pbVar11 = png_ptr->prev_row;
    uVar20 = 0;
    pbVar13 = pbVar12;
    pbVar16 = pbVar5;
    pbVar22 = pbVar11;
    for (uVar21 = 0; pbVar3 = pbVar12, uVar21 != uVar4; uVar21 = uVar21 + 1) {
      pbVar13 = pbVar13 + 1;
      pbVar22 = pbVar22 + 1;
      pbVar16 = pbVar16 + 1;
      bVar9 = *pbVar16 - *pbVar22;
      *pbVar13 = bVar9;
      uVar14 = 0x100 - bVar9;
      if (-1 < (char)bVar9) {
        uVar14 = (uint)bVar9;
      }
      uVar20 = uVar20 + uVar14;
    }
    while( true ) {
      pbVar11 = pbVar11 + 1;
      pbVar5 = pbVar5 + 1;
      if (uVar1 <= uVar4) break;
      bVar9 = *pbVar11;
      uVar18 = (uint)pbVar11[uVar21] - (uint)bVar9;
      uVar17 = (uint)*pbVar5 - (uint)bVar9;
      uVar14 = -uVar18;
      if (0 < (int)uVar18) {
        uVar14 = uVar18;
      }
      uVar6 = -uVar17;
      if (0 < (int)uVar17) {
        uVar6 = uVar17;
      }
      uVar17 = uVar17 + uVar18;
      uVar18 = -uVar17;
      if (0 < (int)uVar17) {
        uVar18 = uVar17;
      }
      if ((uVar6 & 0xff) <= uVar18) {
        bVar9 = pbVar11[uVar21];
      }
      bVar10 = *pbVar5;
      if (uVar18 < (uVar14 & 0xff)) {
        bVar10 = bVar9;
      }
      if ((uVar6 & 0xff) < (uVar14 & 0xff)) {
        bVar10 = bVar9;
      }
      bVar10 = pbVar5[uVar21] - bVar10;
      (pbVar3 + 1)[uVar21] = bVar10;
      uVar14 = 0x100 - bVar10;
      if (-1 < (char)bVar10) {
        uVar14 = (uint)bVar10;
      }
      uVar20 = uVar20 + uVar14;
      if (uVar19 < uVar20) break;
      uVar4 = uVar4 + 1;
      pbVar3 = pbVar3 + 1;
    }
    if ((uVar20 < uVar19) && (input = pbVar12, png_ptr->tst_row != (png_bytep)0x0)) {
      png_ptr->try_row = png_ptr->tst_row;
      png_ptr->tst_row = pbVar12;
    }
  }
  png_compress_IDAT(png_ptr,input,row_info->rowbytes + 1,0);
  ppVar2 = png_ptr->prev_row;
  if (ppVar2 != (png_bytep)0x0) {
    png_ptr->prev_row = png_ptr->row_buf;
    png_ptr->row_buf = ppVar2;
  }
  png_write_finish_row(png_ptr);
  uVar14 = png_ptr->flush_rows + 1;
  png_ptr->flush_rows = uVar14;
  if (uVar14 <= png_ptr->flush_dist - 1) {
    return;
  }
  png_write_flush(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_write_find_filter(png_structrp png_ptr, png_row_infop row_info)
{
#ifndef PNG_WRITE_FILTER_SUPPORTED
   png_write_filtered_row(png_ptr, png_ptr->row_buf, row_info->rowbytes+1);
#else
   unsigned int filter_to_do = png_ptr->do_filter;
   png_bytep row_buf;
   png_bytep best_row;
   png_uint_32 bpp;
   size_t mins;
   size_t row_bytes = row_info->rowbytes;

   png_debug(1, "in png_write_find_filter");

   /* Find out how many bytes offset each pixel is */
   bpp = (row_info->pixel_depth + 7) >> 3;

   row_buf = png_ptr->row_buf;
   mins = PNG_SIZE_MAX - 256/* so we can detect potential overflow of the
                               running sum */;

   /* The prediction method we use is to find which method provides the
    * smallest value when summing the absolute values of the distances
    * from zero, using anything >= 128 as negative numbers.  This is known
    * as the "minimum sum of absolute differences" heuristic.  Other
    * heuristics are the "weighted minimum sum of absolute differences"
    * (experimental and can in theory improve compression), and the "zlib
    * predictive" method (not implemented yet), which does test compressions
    * of lines using different filter methods, and then chooses the
    * (series of) filter(s) that give minimum compressed data size (VERY
    * computationally expensive).
    *
    * GRR 980525:  consider also
    *
    *   (1) minimum sum of absolute differences from running average (i.e.,
    *       keep running sum of non-absolute differences & count of bytes)
    *       [track dispersion, too?  restart average if dispersion too large?]
    *
    *  (1b) minimum sum of absolute differences from sliding average, probably
    *       with window size <= deflate window (usually 32K)
    *
    *   (2) minimum sum of squared differences from zero or running average
    *       (i.e., ~ root-mean-square approach)
    */


   /* We don't need to test the 'no filter' case if this is the only filter
    * that has been chosen, as it doesn't actually do anything to the data.
    */
   best_row = png_ptr->row_buf;

   if (PNG_SIZE_MAX/128 <= row_bytes)
   {
      /* Overflow can occur in the calculation, just select the lowest set
       * filter.
       */
      filter_to_do &= 0U-filter_to_do;
   }
   else if ((filter_to_do & PNG_FILTER_NONE) != 0 &&
         filter_to_do != PNG_FILTER_NONE)
   {
      /* Overflow not possible and multiple filters in the list, including the
       * 'none' filter.
       */
      png_bytep rp;
      size_t sum = 0;
      size_t i;
      unsigned int v;

      {
         for (i = 0, rp = row_buf + 1; i < row_bytes; i++, rp++)
         {
            v = *rp;
#ifdef PNG_USE_ABS
            sum += 128 - abs((int)v - 128);
#else
            sum += (v < 128) ? v : 256 - v;
#endif
         }
      }

      mins = sum;
   }

   /* Sub filter */
   if (filter_to_do == PNG_FILTER_SUB)
   /* It's the only filter so no testing is needed */
   {
      png_setup_sub_row_only(png_ptr, bpp, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_SUB) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum = png_setup_sub_row(png_ptr, bpp, row_bytes, lmins);

      if (sum < mins)
      {
         mins = sum;
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Up filter */
   if (filter_to_do == PNG_FILTER_UP)
   {
      png_setup_up_row_only(png_ptr, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_UP) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum = png_setup_up_row(png_ptr, row_bytes, lmins);

      if (sum < mins)
      {
         mins = sum;
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Avg filter */
   if (filter_to_do == PNG_FILTER_AVG)
   {
      png_setup_avg_row_only(png_ptr, bpp, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_AVG) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum= png_setup_avg_row(png_ptr, bpp, row_bytes, lmins);

      if (sum < mins)
      {
         mins = sum;
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Paeth filter */
   if (filter_to_do == PNG_FILTER_PAETH)
   {
      png_setup_paeth_row_only(png_ptr, bpp, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_PAETH) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum = png_setup_paeth_row(png_ptr, bpp, row_bytes, lmins);

      if (sum < mins)
      {
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Do the actual writing of the filtered row data from the chosen filter. */
   png_write_filtered_row(png_ptr, best_row, row_info->rowbytes+1);

#endif /* WRITE_FILTER */
}